

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelfCwiseBinaryOp.h
# Opt level: O2

void Eigen::internal::
     assign_innervec_CompleteUnrolling<Eigen::SelfCwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_12,_16>
     ::run(SelfCwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>_>
           *dst,Matrix<double,_4,_4,_0,_4,_4> *src)

{
  double dVar1;
  Matrix<double,_4,_4,_0,_4,_4> *pMVar2;
  double dVar3;
  
  pMVar2 = dst->m_matrix;
  dVar3 = (pMVar2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
          array[0xd];
  dVar1 = (src->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
          [0xd];
  (pMVar2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xc]
       = (pMVar2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xc] +
         (src->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
         [0xc];
  (pMVar2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xd]
       = dVar3 + dVar1;
  pMVar2 = dst->m_matrix;
  dVar3 = (pMVar2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
          array[0xf];
  dVar1 = (src->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
          [0xf];
  (pMVar2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xe]
       = (pMVar2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xe] +
         (src->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
         [0xe];
  (pMVar2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xf]
       = dVar3 + dVar1;
  return;
}

Assistant:

void copyPacket(Index row, Index col, const DenseBase<OtherDerived>& other)
    {
      OtherDerived& _other = other.const_cast_derived();
      eigen_internal_assert(row >= 0 && row < rows()
                        && col >= 0 && col < cols());
      m_matrix.template writePacket<StoreMode>(row, col,
        m_functor.packetOp(m_matrix.template packet<StoreMode>(row, col),_other.template packet<LoadMode>(row, col)) );
    }